

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall
HighsSymmetryDetection::cleanupBacktrack(HighsSymmetryDetection *this,HighsInt cellCreationStackPos)

{
  int pos;
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  HighsInt HVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  iVar9 = (int)((ulong)((long)(this->cellCreationStack).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
  do {
    do {
      iVar9 = iVar9 + -1;
      if (iVar9 < cellCreationStackPos) {
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->cellCreationStack,(long)cellCreationStackPos);
        return;
      }
      pos = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9];
      HVar6 = getCellStart(this,pos);
      piVar3 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar3[HVar6];
    } while (iVar1 <= pos);
    lVar7 = (long)pos;
    piVar4 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar2 = piVar5[lVar7 + lVar8];
      if (piVar4[iVar2] != pos) break;
      if ((pos != HVar6) && (piVar4[iVar2] = HVar6, HVar6 - lVar7 != lVar8)) {
        piVar3[lVar7 + lVar8] = HVar6;
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 - pos != (int)lVar8);
  } while( true );
}

Assistant:

void HighsSymmetryDetection::cleanupBacktrack(HighsInt cellCreationStackPos) {
  // the links have been updated. Even though they might still not be fully
  // compressed the cell starts will all point to the correct cell end and the
  // lookup with path compression will give the correct start
  for (HighsInt stackPos = cellCreationStack.size() - 1;
       stackPos >= cellCreationStackPos; --stackPos) {
    HighsInt cell = cellCreationStack[stackPos];

    HighsInt cellStart = getCellStart(cell);
    HighsInt cellEnd = currentPartitionLinks[cellStart];

    for (HighsInt v = cell;
         v < cellEnd && vertexToCell[currentPartition[v]] == cell; ++v)
      updateCellMembership(v, cellStart, false);
  }

  cellCreationStack.resize(cellCreationStackPos);
}